

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O0

void __thiscall gdsForge::GDSwriteUnits(gdsForge *this)

{
  undefined1 local_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  uchar data [20];
  gdsForge *this_local;
  
  local_28 = 0;
  local_27 = 0x14;
  local_26 = 3;
  local_25 = 5;
  local_24 = 0x3e;
  local_23 = 0x41;
  local_22 = 0x89;
  local_21 = 0x37;
  data[0] = 'K';
  data[1] = 0xc6;
  data[2] = 0xa7;
  data[3] = 0xf0;
  data[4] = '9';
  data[5] = 'D';
  data[6] = 0xb8;
  data[7] = '/';
  data[8] = 0xa0;
  data[9] = 0x9b;
  data[10] = 'Z';
  data[0xb] = 'P';
  unique0x10000031 = this;
  fwrite(&local_28,1,0x14,(FILE *)this->gdsFile);
  return;
}

Assistant:

void gdsForge::GDSwriteUnits()
{
  unsigned char data[20];

  data[0] = 0x00;
  data[1] = 0x14;
  data[2] = 0x03;
  data[3] = 0x05;
  data[4] = 0x3e;
  data[5] = 0x41;
  data[6] = 0x89;
  data[7] = 0x37;
  data[8] = 0x4b;
  data[9] = 0xc6;
  data[10] = 0xa7;
  data[11] = 0xf0;
  data[12] = 0x39;
  data[13] = 0x44;
  data[14] = 0xb8;
  data[15] = 0x2f;
  data[16] = 0xa0;
  data[17] = 0x9b;
  data[18] = 0x5a;
  data[19] = 0x50;

  fwrite(data, 1, 20, this->gdsFile);
}